

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ilvev_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  *(undefined2 *)((long)pfVar1 + 0xe) = *(undefined2 *)((long)pfVar2 + 0xc);
  *(undefined2 *)((long)pfVar1 + 0xc) = *(undefined2 *)((long)pfVar3 + 0xc);
  *(undefined2 *)((long)pfVar1 + 10) = *(undefined2 *)((long)pfVar2 + 8);
  *(undefined2 *)((long)pfVar1 + 8) = *(undefined2 *)((long)pfVar3 + 8);
  *(undefined2 *)((long)pfVar1 + 6) = *(undefined2 *)((long)pfVar2 + 4);
  *(undefined2 *)((long)pfVar1 + 4) = *(undefined2 *)((long)pfVar3 + 4);
  *(undefined2 *)((long)pfVar1 + 2) = *(undefined2 *)pfVar2;
  *(undefined2 *)pfVar1 = *(undefined2 *)pfVar3;
  return;
}

Assistant:

void helper_msa_ilvev_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->h[4] = pws->h[5];
    pwd->h[5] = pwt->h[5];
    pwd->h[6] = pws->h[7];
    pwd->h[7] = pwt->h[7];
    pwd->h[0] = pws->h[1];
    pwd->h[1] = pwt->h[1];
    pwd->h[2] = pws->h[3];
    pwd->h[3] = pwt->h[3];
#else
    pwd->h[7] = pws->h[6];
    pwd->h[6] = pwt->h[6];
    pwd->h[5] = pws->h[4];
    pwd->h[4] = pwt->h[4];
    pwd->h[3] = pws->h[2];
    pwd->h[2] = pwt->h[2];
    pwd->h[1] = pws->h[0];
    pwd->h[0] = pwt->h[0];
#endif
}